

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O0

UBool ucnv_extInitialMatchToU_63
                (UConverter *cnv,int32_t *cx,int32_t firstLength,char **src,char *srcLimit,
                UChar **target,UChar *targetLimit,int32_t **offsets,int32_t srcIndex,UBool flush,
                UErrorCode *pErrorCode)

{
  int8_t sisoState;
  int local_54;
  undefined1 *puStack_50;
  int32_t j;
  char *s;
  int32_t match;
  uint32_t value;
  UChar **target_local;
  char *srcLimit_local;
  char **src_local;
  int32_t *piStack_20;
  int32_t firstLength_local;
  int32_t *cx_local;
  UConverter *cnv_local;
  
  s._4_4_ = 0;
  if ((cnv->sharedData->mbcs).outputType == '\f') {
    sisoState = (int8_t)cnv->mode;
  }
  else {
    sisoState = -1;
    if ((cnv->sharedData->mbcs).outputType == 0xdb) {
      sisoState = '\x01';
    }
  }
  _match = target;
  target_local = (UChar **)srcLimit;
  srcLimit_local = (char *)src;
  src_local._4_4_ = firstLength;
  piStack_20 = cx;
  cx_local = (int32_t *)cnv;
  s._0_4_ = ucnv_extMatchToU(cx,sisoState,(char *)cnv->toUBytes,firstLength,*src,
                             (int)srcLimit - (int)*src,(uint32_t *)((long)&s + 4),cnv->useFallback,
                             flush);
  if ((int32_t)s < 1) {
    if ((int32_t)s < 0) {
      *(char *)((long)cx_local + 0x11b) = (char)src_local._4_4_;
      puStack_50 = (undefined1 *)((long)cx_local + 0x41);
      for (local_54 = 0; local_54 < src_local._4_4_; local_54 = local_54 + 1) {
        *(undefined1 *)((long)cx_local + (long)local_54 + 0xfa) = *puStack_50;
        puStack_50 = puStack_50 + 1;
      }
      puStack_50 = *(undefined1 **)srcLimit_local;
      for (; local_54 < -(int32_t)s; local_54 = local_54 + 1) {
        *(undefined1 *)((long)cx_local + (long)local_54 + 0xfa) = *puStack_50;
        puStack_50 = puStack_50 + 1;
      }
      *(undefined1 **)srcLimit_local = puStack_50;
      *(char *)((long)cx_local + 0x11a) = (char)-(int32_t)s;
      cnv_local._7_1_ = '\x01';
    }
    else {
      cnv_local._7_1_ = '\0';
    }
  }
  else {
    *(long *)srcLimit_local = *(long *)srcLimit_local + (long)((int32_t)s - src_local._4_4_);
    ucnv_extWriteToU((UConverter *)cx_local,piStack_20,s._4_4_,_match,targetLimit,offsets,srcIndex,
                     pErrorCode);
    cnv_local._7_1_ = '\x01';
  }
  return cnv_local._7_1_;
}

Assistant:

U_CFUNC UBool
ucnv_extInitialMatchToU(UConverter *cnv, const int32_t *cx,
                        int32_t firstLength,
                        const char **src, const char *srcLimit,
                        UChar **target, const UChar *targetLimit,
                        int32_t **offsets, int32_t srcIndex,
                        UBool flush,
                        UErrorCode *pErrorCode) {
    uint32_t value = 0;  /* initialize output-only param to 0 to silence gcc */
    int32_t match;

    /* try to match */
    match=ucnv_extMatchToU(cx, (int8_t)UCNV_SISO_STATE(cnv),
                           (const char *)cnv->toUBytes, firstLength,
                           *src, (int32_t)(srcLimit-*src),
                           &value,
                           cnv->useFallback, flush);
    if(match>0) {
        /* advance src pointer for the consumed input */
        *src+=match-firstLength;

        /* write result to target */
        ucnv_extWriteToU(cnv, cx,
                         value,
                         target, targetLimit,
                         offsets, srcIndex,
                         pErrorCode);
        return TRUE;
    } else if(match<0) {
        /* save state for partial match */
        const char *s;
        int32_t j;

        /* copy the first code point */
        s=(const char *)cnv->toUBytes;
        cnv->preToUFirstLength=(int8_t)firstLength;
        for(j=0; j<firstLength; ++j) {
            cnv->preToU[j]=*s++;
        }

        /* now copy the newly consumed input */
        s=*src;
        match=-match;
        for(; j<match; ++j) {
            cnv->preToU[j]=*s++;
        }
        *src=s; /* same as *src=srcLimit; because we reached the end of input */
        cnv->preToULength=(int8_t)match;
        return TRUE;
    } else /* match==0 no match */ {
        return FALSE;
    }
}